

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

void tinyexr::cpy4(float *dst_val,float *src_val)

{
  uchar *src;
  uchar *dst;
  float *src_val_local;
  float *dst_val_local;
  
  *(undefined1 *)dst_val = *(undefined1 *)src_val;
  *(undefined1 *)((long)dst_val + 1) = *(undefined1 *)((long)src_val + 1);
  *(undefined1 *)((long)dst_val + 2) = *(undefined1 *)((long)src_val + 2);
  *(undefined1 *)((long)dst_val + 3) = *(undefined1 *)((long)src_val + 3);
  return;
}

Assistant:

static void cpy4(float *dst_val, const float *src_val) {
  unsigned char *dst = reinterpret_cast<unsigned char *>(dst_val);
  const unsigned char *src = reinterpret_cast<const unsigned char *>(src_val);

  dst[0] = src[0];
  dst[1] = src[1];
  dst[2] = src[2];
  dst[3] = src[3];
}